

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecStr.h
# Opt level: O2

void Vec_StrPrintNumStar(Vec_Str_t *p,int Num,int nDigits)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  undefined8 uStack_40;
  char Digits [16];
  
  Digits[0] = '\0';
  Digits[1] = '\0';
  Digits[2] = '\0';
  Digits[3] = '\0';
  Digits[4] = '\0';
  Digits[5] = '\0';
  Digits[6] = '\0';
  Digits[7] = '\0';
  Digits[8] = '\0';
  Digits[9] = '\0';
  Digits[10] = '\0';
  Digits[0xb] = '\0';
  Digits[0xc] = '\0';
  Digits[0xd] = '\0';
  Digits[0xe] = '\0';
  Digits[0xf] = '\0';
  if (Num == 0) {
    iVar1 = 0;
    if (0 < nDigits) {
      iVar1 = nDigits;
    }
    while (iVar1 != 0) {
      uStack_40 = 0x1fe13b;
      Vec_StrPush(p,'0');
      iVar1 = iVar1 + -1;
    }
  }
  else {
    if (Num < 0) {
      uStack_40 = 0x1fe0d9;
      Vec_StrPush(p,'-');
      Num = -Num;
      nDigits = nDigits - 1;
    }
    uVar2 = 0;
    for (; Num != 0; Num = (uint)Num / 10) {
      Digits[uVar2] = (char)((ulong)(uint)Num % 10);
      uVar2 = uVar2 + 1;
    }
    uVar3 = uVar2 & 0xffffffff;
    if ((int)uVar2 < nDigits) {
      uVar3 = (ulong)(uint)nDigits;
    }
    for (; 0 < (long)uVar3; uVar3 = uVar3 - 1) {
      uStack_40 = 0x1fe11d;
      Vec_StrPush(p,Digits[uVar3 - 1] + '0');
    }
  }
  return;
}

Assistant:

static inline void Vec_StrPrintNumStar( Vec_Str_t * p, int Num, int nDigits )
{
    int i;
    char Digits[16] = {0};
    if ( Num == 0 )
    {
        for ( i = 0; i < nDigits; i++ )
            Vec_StrPush( p, '0' );
        return;
    }
    if ( Num < 0 )
    {
        Vec_StrPush( p, '-' );
        Num = -Num;
        nDigits--;
    }
    for ( i = 0; Num; Num /= 10,  i++ )
        Digits[i] = Num % 10;
    for ( i = Abc_MaxInt(i, nDigits)-1; i >= 0; i-- )
        Vec_StrPush( p, (char)('0' + Digits[i]) );
}